

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void help(void)

{
  fwrite("-K [folder] workspace sub folder\n",0x21,1,_stderr);
  fwrite("-o Open Results Data (ORD) output\n",0x22,1,_stderr);
  fwrite("-p [filename] ORD output in parquet format\n",0x2b,1,_stderr);
  fwrite("-s skip header\n",0xf,1,_stderr);
  fwrite("-v version\n",0xb,1,_stderr);
  fwrite("-h help\n",8,1,_stderr);
  return;
}

Assistant:

void help() {

  fprintf(stderr, "-K [folder] workspace sub folder\n");
  fprintf(stderr, "-o Open Results Data (ORD) output\n");
  fprintf(stderr, "-p [filename] ORD output in parquet format\n");
  fprintf(stderr, "-s skip header\n");
  fprintf(stderr, "-v version\n");
  fprintf(stderr, "-h help\n");

}